

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::BinaryAggregateHeap<duckdb::string_t,_float,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<duckdb::string_t,_float,_duckdb::LessThan> *this,
          ArenaAllocator *allocator,string_t *key,float *value)

{
  STORAGE_TYPE *pSVar1;
  undefined4 uVar2;
  bool bVar3;
  char (**ppacVar4) [4];
  pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<float>_> *other;
  idx_t iVar5;
  STORAGE_TYPE *__first;
  pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<float>_> *__first_00;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<float>_>_&,_const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<float>_>_&)>
  __cmp;
  _ValueType __value;
  undefined1 local_88 [16];
  uint32_t local_78;
  char (*local_70) [4];
  HeapEntry<float> local_68;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<float>_>_&,_const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<float>_>_&)>
  local_60;
  anon_union_16_2_67f50693_for_value local_58;
  uint32_t local_48;
  char (*local_40) [4];
  float local_38;
  
  if (this->size < this->capacity) {
    HeapEntry<duckdb::string_t>::Assign(&this->heap[this->size].first,allocator,key);
    __first = this->heap;
    iVar5 = this->size;
    pSVar1 = __first + iVar5;
    (pSVar1->second).value = *value;
    this->size = iVar5 + 1;
    local_60._M_comp = Compare;
    HeapEntry<duckdb::string_t>::HeapEntry
              ((HeapEntry<duckdb::string_t> *)&local_58.pointer,&pSVar1->first);
    local_38 = (pSVar1->second).value;
    if ((uint)local_58._0_4_ < 0xd) {
      ppacVar4 = &local_70;
      local_88._8_8_ = local_58.pointer.ptr;
      local_78 = 0;
    }
    else {
      ppacVar4 = &local_40;
      local_78 = local_48;
      local_70 = local_40;
      local_58.pointer.prefix = *local_40;
      local_88._8_8_ = local_40;
    }
    local_88[4] = local_58.pointer.prefix[0];
    local_88[5] = local_58.pointer.prefix[1];
    local_88[6] = local_58.pointer.prefix[2];
    local_88[7] = local_58.pointer.prefix[3];
    local_88._0_4_ = local_58.pointer.length;
    *ppacVar4 = (char (*) [4])0x0;
  }
  else {
    bVar3 = string_t::StringComparisonOperators::GreaterThan((string_t *)this->heap,key);
    if (!bVar3) {
      return;
    }
    __first_00 = this->heap;
    iVar5 = this->size;
    if (1 < (long)iVar5) {
      other = __first_00 + (iVar5 - 1);
      HeapEntry<duckdb::string_t>::HeapEntry
                ((HeapEntry<duckdb::string_t> *)&local_58.pointer,&other->first);
      local_38 = (other->second).value;
      HeapEntry<duckdb::string_t>::operator=(&other->first,&__first_00->first);
      (other->second).value = (__first_00->second).value;
      if ((uint)local_58._0_4_ < 0xd) {
        ppacVar4 = &local_70;
        local_88._8_8_ = local_58.pointer.ptr;
        local_78 = 0;
        uVar2 = local_58.pointer.prefix;
      }
      else {
        ppacVar4 = &local_40;
        local_78 = local_48;
        local_70 = local_40;
        uVar2 = *local_40;
        local_88._8_8_ = local_40;
      }
      local_88[4] = (char)uVar2;
      local_88[5] = SUB41(uVar2,1);
      local_88[6] = SUB41(uVar2,2);
      local_88[7] = SUB41(uVar2,3);
      local_88._0_4_ = local_58.pointer.length;
      *ppacVar4 = (char (*) [4])0x0;
      local_68.value = local_38;
      ::std::
      __adjust_heap<std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<float>>*,long,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<float>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<float>>const&,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<float>>const&)>>
                (__first_00,0,((long)other - (long)__first_00 >> 3) * -0x3333333333333333,
                 (pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<float>_> *)local_88,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<float>_>_&,_const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<float>_>_&)>
                  )0xd65a48);
      __first_00 = this->heap;
      iVar5 = this->size;
    }
    HeapEntry<duckdb::string_t>::Assign(&__first_00[iVar5 - 1].first,allocator,key);
    __first = this->heap;
    iVar5 = this->size;
    pSVar1 = __first + (iVar5 - 1);
    (pSVar1->second).value = *value;
    local_60._M_comp = Compare;
    HeapEntry<duckdb::string_t>::HeapEntry
              ((HeapEntry<duckdb::string_t> *)&local_58.pointer,&pSVar1->first);
    local_38 = (pSVar1->second).value;
    if ((uint)local_58._0_4_ < 0xd) {
      ppacVar4 = &local_70;
      local_88._8_8_ = local_58.pointer.ptr;
      local_78 = 0;
    }
    else {
      ppacVar4 = &local_40;
      local_78 = local_48;
      local_70 = local_40;
      local_58.pointer.prefix = *local_40;
      local_88._8_8_ = local_40;
    }
    local_88[4] = local_58.pointer.prefix[0];
    local_88[5] = local_58.pointer.prefix[1];
    local_88[6] = local_58.pointer.prefix[2];
    local_88[7] = local_58.pointer.prefix[3];
    local_88._0_4_ = local_58.pointer.length;
    iVar5 = ((long)(iVar5 * 0x28) >> 3) * -0x3333333333333333 - 1;
    *ppacVar4 = (char (*) [4])0x0;
  }
  local_68.value = local_38;
  ::std::
  __push_heap<std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<float>>*,long,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<float>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<float>>const&,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<float>>const&)>>
            (__first,iVar5,0,
             (pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<float>_> *)local_88,
             &local_60);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}